

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O2

bdecode_node * __thiscall
libtorrent::bdecode_node::dict_find
          (bdecode_node *__return_storage_ptr__,bdecode_node *this,string_view key)

{
  bdecode_token *tokens;
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  bdecode_token bVar5;
  
  tokens = this->m_root_tokens;
  iVar3 = this->m_token_idx + 1;
  do {
    bVar5 = tokens[iVar3];
    uVar4 = bVar5._0_4_;
    uVar2 = uVar4 & 0xe0000000;
    if (uVar2 == 0xc0000000) {
      __return_storage_ptr__->m_last_index = 0;
      __return_storage_ptr__->m_last_token = 0;
      __return_storage_ptr__->m_size = 0;
      *(undefined4 *)&__return_storage_ptr__->field_0x3c = 0;
      __return_storage_ptr__->m_buffer = (char *)0x0;
      __return_storage_ptr__->m_buffer_size = 0;
      __return_storage_ptr__->m_token_idx = 0;
      *(undefined1 (*) [16])
       &(__return_storage_ptr__->m_tokens).
        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
      (__return_storage_ptr__->m_tokens).
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->m_tokens).
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      __return_storage_ptr__->m_token_idx = -1;
      __return_storage_ptr__->m_last_index = -1;
      __return_storage_ptr__->m_last_token = -1;
      __return_storage_ptr__->m_size = -1;
      return __return_storage_ptr__;
    }
    if ((*(uint *)(tokens + (long)iVar3 + 1) & 0x1fffffff) -
        ((uVar4 & 0x1fffffff) + (bVar5._4_4_ >> 0x1d) + (uint)(uVar2 != 0x60000000) * 8 + 2) ==
        (int)key._M_len) {
      bVar1 = ::std::__equal<true>::equal<char>
                        (key._M_str,key._M_str + (int)key._M_len,
                         this->m_buffer +
                         (ulong)((bVar5._4_4_ >> 0x1d) + (uint)(uVar2 != 0x60000000) * 8 + 2) +
                         (ulong)(uVar4 & 0x1fffffff));
      bVar5 = tokens[iVar3];
      if (bVar1) {
        bdecode_node(__return_storage_ptr__,tokens,this->m_buffer,this->m_buffer_size,
                     (bVar5._4_4_ & 0x1fffffff) + iVar3);
        return __return_storage_ptr__;
      }
    }
    iVar3 = (bVar5._4_4_ & 0x1fffffff) + iVar3;
    iVar3 = iVar3 + (*(uint *)&tokens[iVar3].field_0x4 & 0x1fffffff);
  } while( true );
}

Assistant:

bdecode_node bdecode_node::dict_find(string_view key) const
	{
		TORRENT_ASSERT(type() == dict_t);

		bdecode_token const* const tokens = m_root_tokens;

		// this is the first item
		int token = m_token_idx + 1;

		while (tokens[token].type != bdecode_token::end)
		{
			bdecode_token const& t = tokens[token];
			TORRENT_ASSERT(t.type == bdecode_token::string
				|| t.type == bdecode_token::long_string);
			int const size = token_source_span(t) - t.start_offset();
			if (int(key.size()) == size
				&& std::equal(key.data(), key.data() + size, m_buffer
					+ t.offset + t.start_offset()))
			{
				// skip key
				token += t.next_item;
				TORRENT_ASSERT(tokens[token].type != bdecode_token::end);

				return bdecode_node(tokens, m_buffer, m_buffer_size, token);
			}

			// skip key
			token += t.next_item;
			TORRENT_ASSERT(tokens[token].type != bdecode_token::end);

			// skip value
			token += tokens[token].next_item;
		}

		return bdecode_node();
	}